

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DotMemberClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DotMemberClauseSyntax,slang::syntax::DotMemberClauseSyntax_const&>
          (BumpAllocator *this,DotMemberClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  DotMemberClauseSyntax *pDVar13;
  
  pDVar13 = (DotMemberClauseSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar5 = (args->dot).kind;
  uVar6 = (args->dot).field_0x2;
  NVar7.raw = (args->dot).numFlags.raw;
  uVar8 = (args->dot).rawLen;
  pIVar3 = (args->dot).info;
  TVar9 = (args->member).kind;
  uVar10 = (args->member).field_0x2;
  NVar11.raw = (args->member).numFlags.raw;
  uVar12 = (args->member).rawLen;
  (pDVar13->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pDVar13->super_SyntaxNode).field_0x4 = uVar4;
  (pDVar13->super_SyntaxNode).parent = pSVar1;
  (pDVar13->super_SyntaxNode).previewNode = pSVar2;
  (pDVar13->dot).kind = TVar5;
  (pDVar13->dot).field_0x2 = uVar6;
  (pDVar13->dot).numFlags = (NumericTokenFlags)NVar7.raw;
  (pDVar13->dot).rawLen = uVar8;
  (pDVar13->dot).info = pIVar3;
  (pDVar13->member).kind = TVar9;
  (pDVar13->member).field_0x2 = uVar10;
  (pDVar13->member).numFlags = (NumericTokenFlags)NVar11.raw;
  (pDVar13->member).rawLen = uVar12;
  (pDVar13->member).info = (args->member).info;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }